

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  undefined1 local_290 [8];
  TestCaseInfo info;
  allocator local_169;
  value_type local_168;
  _Base_ptr local_148;
  undefined1 local_140;
  allocator local_131;
  value_type local_130;
  _Base_ptr local_110;
  undefined1 local_108;
  SpecialProperties local_100;
  char local_f9;
  SpecialProperties prop;
  char c;
  size_t i;
  undefined1 local_e8 [7];
  bool inTag;
  string tag;
  string desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  allocator local_61;
  string local_60;
  byte local_39;
  SourceLineInfo *pSStack_38;
  bool isHidden;
  SourceLineInfo *_lineInfo_local;
  string *_descOrTags_local;
  string *_name_local;
  string *_className_local;
  ITestCase *_testCase_local;
  
  pSStack_38 = _lineInfo;
  _lineInfo_local = (SourceLineInfo *)_descOrTags;
  _descOrTags_local = _name;
  _name_local = _className;
  _className_local = (string *)_testCase;
  _testCase_local = (ITestCase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"./",&local_61);
  bVar2 = startsWith(_name,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_39 = bVar2;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&desc.field_2 + 8));
  std::__cxx11::string::string((string *)(tag.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_e8);
  i._7_1_ = 0;
  for (_prop = 0; uVar1 = _prop, uVar3 = std::__cxx11::string::size(), uVar1 < uVar3;
      _prop = _prop + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)_lineInfo_local);
    local_f9 = *pcVar4;
    if ((i._7_1_ & 1) == 0) {
      if (local_f9 == '[') {
        i._7_1_ = 1;
      }
      else {
        std::__cxx11::string::operator+=((string *)(tag.field_2._M_local_buf + 8),local_f9);
      }
    }
    else if (local_f9 == ']') {
      local_100 = parseSpecialTag((string *)local_e8);
      if (local_100 == IsHidden) {
        local_39 = 1;
      }
      else if (local_100 == None) {
        enforceNotReservedTag((string *)local_e8,pSStack_38);
      }
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&desc.field_2 + 8),(value_type *)local_e8);
      local_110 = (_Base_ptr)pVar5.first._M_node;
      local_108 = pVar5.second;
      std::__cxx11::string::clear();
      i._7_1_ = 0;
    }
    else {
      std::__cxx11::string::operator+=((string *)local_e8,local_f9);
    }
  }
  if ((local_39 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"hide",&local_131);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&desc.field_2 + 8),&local_130);
    local_148 = (_Base_ptr)pVar5.first._M_node;
    local_140 = pVar5.second;
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,".",&local_169);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&desc.field_2 + 8),&local_168);
    info._264_8_ = pVar5.first._M_node;
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_290,_descOrTags_local,_name_local,
             (string *)((long)&tag.field_2 + 8),
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&desc.field_2 + 8),pSStack_38);
  TestCase::TestCase(__return_storage_ptr__,(ITestCase *)_className_local,(TestCaseInfo *)local_290)
  ;
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_290);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)(tag.field_2._M_local_buf + 8));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&desc.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden( startsWith( _name, "./" ) ); // Legacy support

        // Parse out tags
        std::set<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for( std::size_t i = 0; i < _descOrTags.size(); ++i ) {
            char c = _descOrTags[i];
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( prop == TestCaseInfo::IsHidden )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    tags.insert( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            tags.insert( "hide" );
            tags.insert( "." );
        }

        TestCaseInfo info( _name, _className, desc, tags, _lineInfo );
        return TestCase( _testCase, info );
    }